

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O2

int xmlTextWriterWriteDTDNotation
              (xmlTextWriterPtr writer,xmlChar *name,xmlChar *pubid,xmlChar *sysid)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  xmlLinkPtr lk;
  void *pvVar7;
  
  iVar6 = -1;
  if (name == (xmlChar *)0x0 || writer == (xmlTextWriterPtr)0x0) {
    return -1;
  }
  if (*name == '\0') {
    return -1;
  }
  lk = xmlListFront(writer->nodes);
  if (lk == (xmlLinkPtr)0x0) {
    return -1;
  }
  pvVar7 = xmlLinkGetData(lk);
  iVar1 = 0;
  if ((pvVar7 != (void *)0x0) && (iVar1 = 0, *(int *)((long)pvVar7 + 8) != 8)) {
    if (*(int *)((long)pvVar7 + 8) != 7) {
      return -1;
    }
    iVar1 = xmlOutputBufferWriteString(writer->out," [");
    if (iVar1 < 0) {
      return -1;
    }
    if (writer->indent != 0) {
      iVar2 = xmlOutputBufferWriteString(writer->out,"\n");
      if (iVar2 < 0) {
        return -1;
      }
      iVar1 = iVar1 + iVar2;
    }
    *(undefined4 *)((long)pvVar7 + 8) = 8;
  }
  if (writer->indent != 0) {
    iVar2 = xmlTextWriterWriteIndent(writer);
    if (iVar2 < 0) {
      return -1;
    }
    iVar1 = iVar1 + iVar2;
  }
  iVar2 = xmlOutputBufferWriteString(writer->out,"<!NOTATION ");
  if (iVar2 < 0) {
    return -1;
  }
  iVar3 = xmlOutputBufferWriteString(writer->out,(char *)name);
  if (iVar3 < 0) {
    return -1;
  }
  iVar3 = iVar2 + iVar1 + iVar3;
  if (pubid == (xmlChar *)0x0) {
    if (sysid == (xmlChar *)0x0) goto LAB_001d142a;
    iVar1 = xmlOutputBufferWriteString(writer->out," SYSTEM");
    if (iVar1 < 0) {
      return -1;
    }
    iVar3 = iVar1 + iVar3;
  }
  else {
    iVar1 = xmlOutputBufferWriteString(writer->out," PUBLIC ");
    if (iVar1 < 0) {
      return -1;
    }
    iVar2 = xmlOutputBufferWrite(writer->out,1,&writer->qchar);
    if (iVar2 < 0) {
      return -1;
    }
    iVar4 = xmlOutputBufferWriteString(writer->out,(char *)pubid);
    if (iVar4 < 0) {
      return -1;
    }
    iVar5 = xmlOutputBufferWrite(writer->out,1,&writer->qchar);
    if (iVar5 < 0) {
      return -1;
    }
    iVar3 = iVar2 + iVar4 + iVar5 + iVar1 + iVar3;
    if (sysid == (xmlChar *)0x0) goto LAB_001d142a;
  }
  iVar1 = xmlOutputBufferWriteString(writer->out," ");
  if (iVar1 < 0) {
    return -1;
  }
  iVar2 = xmlOutputBufferWrite(writer->out,1,&writer->qchar);
  if (iVar2 < 0) {
    return -1;
  }
  iVar4 = xmlOutputBufferWriteString(writer->out,(char *)sysid);
  if (iVar4 < 0) {
    return -1;
  }
  iVar5 = xmlOutputBufferWrite(writer->out,1,&writer->qchar);
  if (iVar5 < 0) {
    return -1;
  }
  iVar3 = iVar2 + iVar4 + iVar5 + iVar1 + iVar3;
LAB_001d142a:
  iVar1 = xmlOutputBufferWriteString(writer->out,">");
  if (-1 < iVar1) {
    iVar6 = iVar1 + iVar3;
  }
  return iVar6;
}

Assistant:

int
xmlTextWriterWriteDTDNotation(xmlTextWriterPtr writer,
                              const xmlChar * name,
                              const xmlChar * pubid, const xmlChar * sysid)
{
    int count;
    int sum;
    xmlLinkPtr lk;
    xmlTextWriterStackEntry *p;

    if (writer == NULL || name == NULL || *name == '\0')
        return -1;

    sum = 0;
    lk = xmlListFront(writer->nodes);
    if (lk == 0) {
        return -1;
    }

    p = (xmlTextWriterStackEntry *) xmlLinkGetData(lk);
    if (p != 0) {
        switch (p->state) {
            case XML_TEXTWRITER_DTD:
                count = xmlOutputBufferWriteString(writer->out, " [");
                if (count < 0)
                    return -1;
                sum += count;
                if (writer->indent) {
                    count = xmlOutputBufferWriteString(writer->out, "\n");
                    if (count < 0)
                        return -1;
                    sum += count;
                }
                p->state = XML_TEXTWRITER_DTD_TEXT;
                /* fallthrough */
            case XML_TEXTWRITER_DTD_TEXT:
                break;
            default:
                return -1;
        }
    }

    if (writer->indent) {
        count = xmlTextWriterWriteIndent(writer);
        if (count < 0)
            return -1;
        sum += count;
    }

    count = xmlOutputBufferWriteString(writer->out, "<!NOTATION ");
    if (count < 0)
        return -1;
    sum += count;
    count = xmlOutputBufferWriteString(writer->out, (const char *) name);
    if (count < 0)
        return -1;
    sum += count;

    if (pubid != 0) {
        count = xmlOutputBufferWriteString(writer->out, " PUBLIC ");
        if (count < 0)
            return -1;
        sum += count;
        count = xmlOutputBufferWrite(writer->out, 1, &writer->qchar);
        if (count < 0)
            return -1;
        sum += count;
        count =
            xmlOutputBufferWriteString(writer->out, (const char *) pubid);
        if (count < 0)
            return -1;
        sum += count;
        count = xmlOutputBufferWrite(writer->out, 1, &writer->qchar);
        if (count < 0)
            return -1;
        sum += count;
    }

    if (sysid != 0) {
        if (pubid == 0) {
            count = xmlOutputBufferWriteString(writer->out, " SYSTEM");
            if (count < 0)
                return -1;
            sum += count;
        }
        count = xmlOutputBufferWriteString(writer->out, " ");
        if (count < 0)
            return -1;
        sum += count;
        count = xmlOutputBufferWrite(writer->out, 1, &writer->qchar);
        if (count < 0)
            return -1;
        sum += count;
        count =
            xmlOutputBufferWriteString(writer->out, (const char *) sysid);
        if (count < 0)
            return -1;
        sum += count;
        count = xmlOutputBufferWrite(writer->out, 1, &writer->qchar);
        if (count < 0)
            return -1;
        sum += count;
    }

    count = xmlOutputBufferWriteString(writer->out, ">");
    if (count < 0)
        return -1;
    sum += count;

    return sum;
}